

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

_Bool render_tour_image(char *filepath,Instance *instance,Tour *tour,char *filext)

{
  uint uVar1;
  Vec2d *a;
  Vec2d *b;
  FILE *__stream;
  int32_t *piVar2;
  uint *puVar3;
  double dVar4;
  double local_20f0;
  double local_20e0;
  double local_20d8;
  double local_20d0;
  double local_20c8;
  double local_20c0;
  int exit_code;
  int32_t next_vertex;
  int32_t curr_vertex;
  int32_t i_2;
  int32_t first_node_in_comp;
  int32_t comp;
  Vec2d *pos;
  int32_t i_1;
  FILE *gp;
  char command [8192];
  double d;
  Vec2d *jpos;
  Vec2d *ipos;
  int32_t j;
  int32_t i;
  double h;
  double w;
  double lly;
  double llx;
  double smaller_coord;
  double min_dist;
  _Bool result;
  char *pcStack_28;
  int32_t n;
  char *filext_local;
  Tour *tour_local;
  Instance *instance_local;
  char *filepath_local;
  
  pcStack_28 = filext;
  filext_local = (char *)tour;
  tour_local = (Tour *)instance;
  instance_local = (Instance *)filepath;
  pcStack_28 = guess_plot_filext(filepath,filext);
  min_dist._4_4_ = *(int *)&tour_local->comp + 1;
  min_dist._3_1_ = 1;
  smaller_coord = 9999999999.0;
  llx = 9999999999.0;
  compute_plotting_region((Instance *)tour_local,&lly,&w,&h,(double *)&j);
  for (ipos._4_4_ = 0; ipos._4_4_ < min_dist._4_4_; ipos._4_4_ = ipos._4_4_ + 1) {
    for (ipos._0_4_ = 0; (int)ipos < min_dist._4_4_; ipos._0_4_ = (int)ipos + 1) {
      if (ipos._4_4_ != (int)ipos) {
        a = (Vec2d *)(tour_local[1].comp + (long)ipos._4_4_ * 4);
        b = (Vec2d *)(tour_local[1].comp + (long)(int)ipos * 4);
        if (a->x <= llx) {
          local_20c0 = a->x;
        }
        else {
          local_20c0 = llx;
        }
        if (a->y <= local_20c0) {
          local_20c8 = a->y;
        }
        else {
          local_20c8 = local_20c0;
        }
        if (b->x <= local_20c8) {
          local_20d0 = b->x;
        }
        else {
          local_20d0 = local_20c8;
        }
        if (b->y <= local_20d0) {
          local_20d8 = b->y;
        }
        else {
          local_20d8 = local_20d0;
        }
        llx = local_20d8;
        local_20e0 = vec2d_dist(a,b);
        if (smaller_coord < local_20e0) {
          local_20e0 = smaller_coord;
        }
        smaller_coord = local_20e0;
      }
    }
  }
  dVar4 = sqrt(smaller_coord);
  if (_j <= h) {
    local_20f0 = _j;
  }
  else {
    local_20f0 = h;
  }
  smaller_coord = dVar4 / local_20f0;
  memset(&gp,0,0x2000);
  snprintf((char *)&gp,0x2000,"neato \'-T%s\' -o \'%s\' 1> /dev/null 2>/dev/null",pcStack_28,
           instance_local);
  command[0x1ff7] = '\0';
  log_log(0x20,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
          ,0x6f,"%s :: Running popen(%s)\n","render_tour_image",&gp);
  __stream = popen((char *)&gp,"w");
  if (__stream == (FILE *)0x0) {
    min_dist._3_1_ = 0;
  }
  else {
    fprintf(__stream,"strict digraph {\n");
    fprintf(__stream,"    labelloc=\"t\"\n");
    fprintf(__stream,"    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = \"monospace\"]\n");
    fprintf(__stream,"    node [style=filled]\n");
    for (pos._4_4_ = 0; (int)pos._4_4_ < min_dist._4_4_; pos._4_4_ = pos._4_4_ + 1) {
      fprintf(__stream,
              "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" shape=\"circle\" label=\"%d\"]\n"
              ,((*(double *)(tour_local[1].comp + (long)(int)pos._4_4_ * 4) - lly) / h) /
               smaller_coord,
              ((*(double *)((long)(tour_local[1].comp + (long)(int)pos._4_4_ * 4) + 8) - w) / _j) /
              smaller_coord,(ulong)pos._4_4_,(ulong)pos._4_4_);
    }
    if (*(int *)(filext_local + 4) != 1) {
      __assert_fail("tour->num_comps == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                    ,0x8b,
                    "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)")
      ;
    }
    for (i_2 = 0; i_2 < *(int *)(filext_local + 4); i_2 = i_2 + 1) {
      curr_vertex = -1;
      for (next_vertex = 0; next_vertex < min_dist._4_4_; next_vertex = next_vertex + 1) {
        piVar2 = tcomp((Tour *)filext_local,next_vertex);
        if (*piVar2 == i_2) {
          curr_vertex = next_vertex;
          break;
        }
      }
      if (curr_vertex != 0) {
        __assert_fail("first_node_in_comp == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                      ,0x96,
                      "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)"
                     );
      }
      exit_code = curr_vertex;
      while( true ) {
        puVar3 = (uint *)tsucc((Tour *)filext_local,exit_code);
        uVar1 = *puVar3;
        if (uVar1 == 0) break;
        fprintf(__stream,"   %d -> %d [fontsize=\"8\"]\n",(ulong)(uint)exit_code,(ulong)uVar1);
        exit_code = uVar1;
      }
      fprintf(__stream,"   %d -> %d [fontsize=\"8\"]\n",(ulong)(uint)exit_code,0);
    }
    fprintf(__stream,"}\n");
  }
  if (__stream != (FILE *)0x0) {
    uVar1 = pclose(__stream);
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
            ,0xb0,"%s :: graphviz dump creation process terminated with exit code %d",
            "render_tour_image",(ulong)uVar1);
    min_dist._3_1_ = uVar1 == 0;
  }
  return (_Bool)(min_dist._3_1_ & 1);
}

Assistant:

bool render_tour_image(const char *filepath, const Instance *instance,
                       Tour *tour, const char *filext) {

    // Try to autodetect the filepath
    filext = guess_plot_filext(filepath, filext);

    int32_t n = instance->num_customers + 1;
    bool result = true;

    double min_dist = 9999999999;
    double smaller_coord = 9999999999;
    double llx, lly, w, h;

    compute_plotting_region(instance, &llx, &lly, &w, &h);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            if (i != j) {
                const Vec2d *ipos = &instance->positions[i];
                const Vec2d *jpos = &instance->positions[j];

                smaller_coord = MIN(smaller_coord, ipos->x);
                smaller_coord = MIN(smaller_coord, ipos->y);
                smaller_coord = MIN(smaller_coord, jpos->x);
                smaller_coord = MIN(smaller_coord, jpos->y);

                double d = vec2d_dist(ipos, jpos);
                min_dist = MIN(min_dist, d);
            }
        }
    }

    min_dist = sqrt(min_dist) / MIN(w, h);

    // min_dist = exp(min_dist);

    char command[8192] = "";

    snprintf(command, ARRAY_LEN(command),
             "neato '-T%s' -o '%s' 1> /dev/null 2>/dev/null", filext, filepath);
    command[ARRAY_LEN(command) - 1] = '\0';

    log_info("%s :: Running popen(%s)\n", __func__, command);

    FILE *gp = popen(command, "w");
    if (!gp) {
        result = false;
        goto terminate;
    }

    fprintf(gp, "strict digraph {\n");
    fprintf(gp, "    labelloc=\"t\"\n");
    fprintf(gp, "    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = "
                "\"monospace\"]\n");
    fprintf(gp, "    node [style=filled]\n");

    //
    // Declare the nodes and style them. Apply some size normalization for the
    // output render target.
    //
    for (int32_t i = 0; i < n; i++) {
        const Vec2d *pos = &instance->positions[i];

        fprintf(gp,
                "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" "
                "shape=\"circle\" label=\"%d\"]\n",
                i, ((pos->x - llx) / w / min_dist),
                ((pos->y - lly) / h / min_dist), i);
    }

    assert(tour->num_comps == 1);

    for (int32_t comp = 0; comp < tour->num_comps; comp++) {
        int32_t first_node_in_comp = -1;
        for (int32_t i = 0; i < n; i++) {
            if (*tcomp(tour, i) == comp) {
                first_node_in_comp = i;
                break;
            }
        }

        assert(first_node_in_comp == 0);

        if (first_node_in_comp != -1) {

            int32_t curr_vertex = first_node_in_comp;
            int32_t next_vertex = curr_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) !=
                   first_node_in_comp) {
                fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                        next_vertex);
                curr_vertex = next_vertex;
            }
            assert(next_vertex == first_node_in_comp);
            fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                    first_node_in_comp);
        }
    }

    fprintf(gp, "}\n");

terminate:
    if (gp) {
        int exit_code = pclose(gp);
        log_info("%s :: graphviz dump creation process terminated with "
                 "exit code %d",
                 __func__, exit_code);
        result = exit_code == 0;
    }

    return result;
}